

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
FastVector<ExecutorX86::Breakpoint,_false,_false>::grow_and_add
          (FastVector<ExecutorX86::Breakpoint,_false,_false> *this,uint newSize,Breakpoint *val)

{
  uint uVar1;
  uint uVar2;
  Breakpoint *ptr;
  Breakpoint *pBVar3;
  bool bVar4;
  uint oldMax;
  Breakpoint *oldData;
  Breakpoint *val_local;
  uint newSize_local;
  FastVector<ExecutorX86::Breakpoint,_false,_false> *this_local;
  
  ptr = this->data;
  uVar1 = this->max;
  grow_no_destroy(this,newSize);
  pBVar3 = this->data;
  uVar2 = this->count;
  this->count = uVar2 + 1;
  pBVar3[uVar2].instIndex = val->instIndex;
  bVar4 = val->oneHit;
  pBVar3 = pBVar3 + uVar2;
  pBVar3->oldOpcode = val->oldOpcode;
  pBVar3->oneHit = bVar4;
  if (ptr != (Breakpoint *)0x0) {
    NULLC::destruct<ExecutorX86::Breakpoint>(ptr,(ulong)uVar1);
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}